

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationIndex.cpp
# Opt level: O3

unique_ptr<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
 __thiscall
VariationIndex::_getDeletions(VariationIndex *this,int chromosome_id,size_t start,size_t end)

{
  iterator __position;
  node_pointer ppVar1;
  iterator<boost::unordered::detail::ptr_node<std::pair<const_int,_VariationIndex::chromosome_record_t>_>_>
  iVar2;
  ulong uVar3;
  node_pointer ppVar4;
  pointer __p;
  int iVar5;
  undefined1 *puVar6;
  long lVar7;
  undefined4 in_register_00000034;
  long lVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong uVar11;
  vector<unsigned_long,std::allocator<unsigned_long>> *this_00;
  ulong in_R8;
  ulong uVar12;
  unsigned_long *k;
  emplace_return eVar13;
  unordered_set<unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  candidates;
  int local_6c;
  ulong local_68;
  table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
  local_60;
  
  lVar8 = CONCAT44(in_register_00000034,chromosome_id);
  local_6c = (int)start;
  local_68 = in_R8;
  ppVar1 = boost::unordered::detail::
           table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
           ::find_node_impl<int,std::equal_to<int>>
                     ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                       *)(lVar8 + 0x10),(long)local_6c,&local_6c,
                      (equal_to<int> *)((ulong)(*(byte *)(lVar8 + 0x10) & 1) + lVar8 + 0x11));
  if (ppVar1 != (node_pointer)0x0) {
    eVar13 = boost::unordered::detail::
             table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
             ::try_emplace_unique<int_const&>
                       ((table<boost::unordered::detail::map<std::allocator<std::pair<int_const,VariationIndex::chromosome_record_t>>,int,VariationIndex::chromosome_record_t,boost::hash<int>,std::equal_to<int>>>
                         *)(lVar8 + 0x10),&local_6c);
    iVar2 = eVar13.first.node_;
    uVar3 = (end - 1) / *(ulong *)(lVar8 + 0x78);
    lVar8 = *(long *)((long)&((iVar2.node_)->value_base_).data_.data_ + 0x20);
    if (uVar3 < (ulong)(*(long *)((long)&((iVar2.node_)->value_base_).data_.data_ + 0x28) - lVar8 >>
                       5)) {
      local_60.super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>.current_ =
           0;
      uVar9 = 0x26;
      puVar6 = boost::unordered::detail::prime_list_template<unsigned_long>::value;
      do {
        uVar11 = uVar9 >> 1;
        uVar12 = ~uVar11 + uVar9;
        uVar9 = uVar11;
        if (*(ulong *)((long)puVar6 + uVar11 * 8) < 0xb) {
          puVar6 = (undefined1 *)((ulong *)((long)puVar6 + uVar11 * 8) + 1);
          uVar9 = uVar12;
        }
      } while (0 < (long)uVar9);
      puVar10 = (ulong *)(boost::unordered::detail::prime_list_template<unsigned_long>::value +
                         0x128);
      if (puVar6 != &DAT_0019a950) {
        puVar10 = (ulong *)puVar6;
      }
      local_60.bucket_count_ = *puVar10;
      local_60.size_ = 0;
      local_60.mlf_ = 1.0;
      local_60.max_load_ = 0;
      local_60.buckets_ = (bucket_pointer)0x0;
      this->_vptr_VariationIndex = (_func_int **)0x0;
      uVar3 = *(ulong *)(lVar8 + uVar3 * 0x20);
      lVar8 = *(long *)((long)&((iVar2.node_)->value_base_).data_.data_ + 8);
      if (uVar3 < (ulong)((*(long *)((long)&((iVar2.node_)->value_base_).data_.data_ + 0x10) - lVar8
                          >> 3) * -0x5555555555555555)) {
        lVar7 = uVar3 * 0x18 + 8;
        do {
          uVar9 = *(ulong *)(lVar8 + -8 + lVar7);
          if (local_68 < uVar9) break;
          iVar5 = *(int *)(lVar8 + 8 + lVar7);
          if ((uVar9 == end) && (iVar5 == 1)) {
            boost::unordered::detail::
            table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
            ::emplace_unique<unsigned_long_const&>
                      ((table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                        *)&local_60,(const_key_type *)(lVar7 + lVar8),
                       (const_key_type *)(lVar7 + lVar8));
            uVar9 = *(ulong *)(lVar8 + -8 + lVar7);
            iVar5 = *(int *)(lVar8 + 8 + lVar7);
          }
          if ((uVar9 == local_68) && (iVar5 == 2)) {
            k = (unsigned_long *)(lVar8 + lVar7);
            ppVar4 = boost::unordered::detail::
                     table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                     ::find_node_impl<unsigned_long,std::equal_to<unsigned_long>>
                               ((table<boost::unordered::detail::set<std::allocator<unsigned_long>,unsigned_long,boost::hash<unsigned_long>,std::equal_to<unsigned_long>>>
                                 *)&local_60,*(size_t *)(lVar8 + lVar7),k,
                                (equal_to<unsigned_long> *)
                                (local_60.
                                 super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>
                                 .funcs_ +
                                (local_60.
                                 super_functions<boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>
                                 .current_ & 1)));
            if (ppVar4 != (node_pointer)0x0) {
              this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                        this->_vptr_VariationIndex;
              if (this_00 == (vector<unsigned_long,std::allocator<unsigned_long>> *)0x0) {
                __p = (pointer)operator_new(0x18);
                (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                (__p->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                std::
                __uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                ::reset((__uniq_ptr_impl<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         *)this,__p);
                this_00 = (vector<unsigned_long,std::allocator<unsigned_long>> *)
                          this->_vptr_VariationIndex;
              }
              __position._M_current = *(unsigned_long **)(this_00 + 8);
              if (__position._M_current == *(unsigned_long **)(this_00 + 0x10)) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>(this_00,__position,k);
              }
              else {
                *__position._M_current = *k;
                *(unsigned_long **)(this_00 + 8) = __position._M_current + 1;
              }
            }
          }
          uVar3 = uVar3 + 1;
          lVar8 = *(long *)((long)&((iVar2.node_)->value_base_).data_.data_ + 8);
          lVar7 = lVar7 + 0x18;
        } while (uVar3 < (ulong)((*(long *)((long)&((iVar2.node_)->value_base_).data_.data_ + 0x10)
                                  - lVar8 >> 3) * -0x5555555555555555));
      }
      boost::unordered::detail::
      table<boost::unordered::detail::set<std::allocator<unsigned_long>,_unsigned_long,_boost::hash<unsigned_long>,_std::equal_to<unsigned_long>_>_>
      ::delete_buckets(&local_60);
      return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
              )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
                )this;
    }
  }
  this->_vptr_VariationIndex = (_func_int **)0x0;
  return (__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::default_delete<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<std::vector<size_t> > VariationIndex::_getDeletions(int chromosome_id, size_t start, size_t end) {
	if (chromosomes.find(chromosome_id) == chromosomes.end()) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const chromosome_record_t& chromosome_record = chromosomes[chromosome_id];
	size_t k = (start-1) / step_size;
	if (chromosome_record.checkpoint_list.size() <= k) {
		return unique_ptr<vector<size_t> >(nullptr);
	}
	const vector<event_t>& event_list = chromosome_record.events;
	boost::unordered_set<size_t> candidates;
	unique_ptr<vector<size_t> > result(nullptr);
	for (size_t i=chromosome_record.checkpoint_list[k].index; i<event_list.size(); ++i) {
		const event_t& event = event_list[i];
		if (event.position > end) break;
		if ((event.position == start) && (event.type == DELETION_START)) {
			candidates.insert(event.variation_index);
		}
		if ((event.position == end) && (event.type == DELETION_END)) {
			if (candidates.find(event.variation_index) != candidates.end()) {
				if (result.get() == 0) {
					result = unique_ptr<vector<size_t> >(new vector<size_t>());
				}
				result->push_back(event.variation_index);
			}
		}
	}
	return result;
}